

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ConfigUseClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConfigUseClauseSyntax,slang::parsing::Token&,slang::syntax::ConfigCellIdentifierSyntax*&,slang::syntax::ParameterValueAssignmentSyntax*&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,ConfigCellIdentifierSyntax **args_1,
          ParameterValueAssignmentSyntax **args_2,Token *args_3,Token *args_4)

{
  Token use;
  Token colon;
  Token config;
  ConfigUseClauseSyntax *this_00;
  Token *args_local_4;
  Token *args_local_3;
  ParameterValueAssignmentSyntax **args_local_2;
  ConfigCellIdentifierSyntax **args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (ConfigUseClauseSyntax *)allocate(this,0x50,8);
  use.kind = args->kind;
  use._2_1_ = args->field_0x2;
  use.numFlags.raw = (args->numFlags).raw;
  use.rawLen = args->rawLen;
  use.info = args->info;
  colon.kind = args_3->kind;
  colon._2_1_ = args_3->field_0x2;
  colon.numFlags.raw = (args_3->numFlags).raw;
  colon.rawLen = args_3->rawLen;
  colon.info = args_3->info;
  config.kind = args_4->kind;
  config._2_1_ = args_4->field_0x2;
  config.numFlags.raw = (args_4->numFlags).raw;
  config.rawLen = args_4->rawLen;
  config.info = args_4->info;
  slang::syntax::ConfigUseClauseSyntax::ConfigUseClauseSyntax
            (this_00,use,*args_1,*args_2,colon,config);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }